

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::python::Generator::OptionsValue
          (string *__return_storage_ptr__,Generator *this,string *class_name,
          string *serialized_options)

{
  bool bVar1;
  long lVar2;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_60 [8];
  string full_class_name;
  allocator<char> local_29;
  string *local_28;
  string *serialized_options_local;
  string *class_name_local;
  Generator *this_local;
  
  local_28 = serialized_options;
  serialized_options_local = class_name;
  class_name_local = (string *)this;
  this_local = (Generator *)__return_storage_ptr__;
  lVar2 = std::__cxx11::string::length();
  if ((lVar2 != 0) && (bVar1 = GeneratingDescriptorProto(this), !bVar1)) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                   "descriptor_pb2.",serialized_options_local);
    std::operator+(&local_c0,"_descriptor._ParseOptions(",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
    std::operator+(&local_a0,&local_c0,"(), \'");
    CEscape(&local_e0,local_28);
    std::operator+(&local_80,&local_a0,&local_e0);
    std::operator+(__return_storage_ptr__,&local_80,"\')");
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)local_60);
    return __return_storage_ptr__;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"None",&local_29);
  std::allocator<char>::~allocator(&local_29);
  return __return_storage_ptr__;
}

Assistant:

string Generator::OptionsValue(
    const string& class_name, const string& serialized_options) const {
  if (serialized_options.length() == 0 || GeneratingDescriptorProto()) {
    return "None";
  } else {
    string full_class_name = "descriptor_pb2." + class_name;
    return "_descriptor._ParseOptions(" + full_class_name + "(), '"
        + CEscape(serialized_options)+ "')";
  }
}